

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_af1b6::CpuAbsoluteTest_and_abs_sets_zero_clears_neg_Test::TestBody
          (CpuAbsoluteTest_and_abs_sets_zero_clears_neg_Test *this)

{
  (this->super_CpuAbsoluteTest).super_CpuTest.registers.a = 0xaa;
  (this->super_CpuAbsoluteTest).super_CpuTest.registers.p = 0x80;
  (this->super_CpuAbsoluteTest).super_CpuTest.expected.a = '\0';
  (this->super_CpuAbsoluteTest).super_CpuTest.expected.p = '\x02';
  (this->super_CpuAbsoluteTest).super_CpuTest.field_0x114 = 0x55;
  CpuAbsoluteTest::run_read_instruction(&this->super_CpuAbsoluteTest,'-');
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, and_abs_sets_zero_clears_neg) {
    registers.a = 0b10101010;
    registers.p = N_FLAG;
    expected.a = 0b00000000;
    expected.p = Z_FLAG;
    memory_content = 0b01010101;

    run_read_instruction(AND_ABS);
}